

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

int __thiscall Fl_Text_Display::move_left(Fl_Text_Display *this)

{
  int newPos;
  
  if (0 < this->mCursorPos) {
    newPos = Fl_Text_Buffer::prev_char_clipped(this->mBuffer,this->mCursorPos);
    insert_position(this,newPos);
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Text_Display::move_left() {
  if ( mCursorPos <= 0 )
    return 0;
  int p = insert_position();
  int q = buffer()->prev_char_clipped(p);
  insert_position(q);
  return 1;
}